

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_wav_dr_callback__seek(void *pUserData,int offset,ma_dr_wav_seek_origin origin)

{
  int iVar1;
  
  iVar1 = (**(code **)((long)pUserData + 0x50))
                    (*(undefined8 *)((long)pUserData + 0x60),(long)offset,
                     origin == ma_dr_wav_seek_origin_current);
  return (ma_bool32)(iVar1 == 0);
}

Assistant:

static ma_bool32 ma_wav_dr_callback__seek(void* pUserData, int offset, ma_dr_wav_seek_origin origin)
{
    ma_wav* pWav = (ma_wav*)pUserData;
    ma_result result;
    ma_seek_origin maSeekOrigin;

    MA_ASSERT(pWav != NULL);

    maSeekOrigin = ma_seek_origin_start;
    if (origin == ma_dr_wav_seek_origin_current) {
        maSeekOrigin =  ma_seek_origin_current;
    }

    result = pWav->onSeek(pWav->pReadSeekTellUserData, offset, maSeekOrigin);
    if (result != MA_SUCCESS) {
        return MA_FALSE;
    }

    return MA_TRUE;
}